

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>_> __thiscall
pbrt::syntactic::Param::as<pbrt::syntactic::Texture>(Param *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>_> sVar1;
  __shared_ptr<pbrt::syntactic::Param,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<pbrt::syntactic::Param,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<pbrt::syntactic::Param,void>
            (local_20,(__weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8)
            );
  std::
  dynamic_pointer_cast<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>,pbrt::syntactic::Param>
            ((shared_ptr<pbrt::syntactic::Param> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  sVar1.
  super___shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.
  super___shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>_>)
         sVar1.
         super___shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<ParamArray<T>> Param::as()
    { return std::dynamic_pointer_cast<ParamArray<T>>(shared_from_this()); }